

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getnameinfo.c
# Opt level: O1

int uv_getnameinfo(uv_loop_t *loop,uv_getnameinfo_t *req,uv_getnameinfo_cb getnameinfo_cb,
                  sockaddr *addr,int flags)

{
  uv__work *w;
  undefined8 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  iVar2 = -0x16;
  if (addr != (sockaddr *)0x0 && req != (uv_getnameinfo_t *)0x0) {
    if (addr->sa_family == 10) {
      uVar3._0_2_ = addr->sa_family;
      uVar3._2_1_ = addr->sa_data[0];
      uVar3._3_1_ = addr->sa_data[1];
      uVar4 = *(undefined4 *)(addr->sa_data + 2);
      uVar5 = *(undefined4 *)(addr->sa_data + 6);
      uVar6 = *(undefined4 *)(addr->sa_data + 10);
      uVar1 = *(undefined8 *)(addr[1].sa_data + 2);
      *(undefined8 *)((req->storage).__ss_padding + 10) = *(undefined8 *)(addr->sa_data + 10);
      *(undefined8 *)((req->storage).__ss_padding + 0x12) = uVar1;
    }
    else {
      if (addr->sa_family != 2) {
        return -0x16;
      }
      uVar3._0_2_ = addr->sa_family;
      uVar3._2_1_ = addr->sa_data[0];
      uVar3._3_1_ = addr->sa_data[1];
      uVar4 = *(undefined4 *)(addr->sa_data + 2);
      uVar5 = *(undefined4 *)(addr->sa_data + 6);
      uVar6 = *(undefined4 *)(addr->sa_data + 10);
    }
    (req->storage).ss_family = (short)uVar3;
    (req->storage).__ss_padding[0] = (char)((uint)uVar3 >> 0x10);
    (req->storage).__ss_padding[1] = (char)((uint)uVar3 >> 0x18);
    *(undefined4 *)((req->storage).__ss_padding + 2) = uVar4;
    *(undefined4 *)((req->storage).__ss_padding + 6) = uVar5;
    *(undefined4 *)((req->storage).__ss_padding + 10) = uVar6;
    req->loop = loop;
    req->type = UV_GETNAMEINFO;
    (loop->active_reqs).count = (loop->active_reqs).count + 1;
    req->getnameinfo_cb = getnameinfo_cb;
    req->flags = flags;
    req->type = UV_GETNAMEINFO;
    req->retcode = 0;
    w = &req->work_req;
    if (getnameinfo_cb == (uv_getnameinfo_cb)0x0) {
      uv__getnameinfo_work(w);
      uv__getnameinfo_done(w,0);
      iVar2 = req->retcode;
    }
    else {
      uv__work_submit(loop,w,UV__WORK_SLOW_IO,uv__getnameinfo_work,uv__getnameinfo_done);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv_getnameinfo(uv_loop_t* loop,
                   uv_getnameinfo_t* req,
                   uv_getnameinfo_cb getnameinfo_cb,
                   const struct sockaddr* addr,
                   int flags) {
  if (req == NULL || addr == NULL)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET) {
    memcpy(&req->storage,
           addr,
           sizeof(struct sockaddr_in));
  } else if (addr->sa_family == AF_INET6) {
    memcpy(&req->storage,
           addr,
           sizeof(struct sockaddr_in6));
  } else {
    return UV_EINVAL;
  }

  uv__req_init(loop, (uv_req_t*)req, UV_GETNAMEINFO);

  req->getnameinfo_cb = getnameinfo_cb;
  req->flags = flags;
  req->type = UV_GETNAMEINFO;
  req->retcode = 0;

  if (getnameinfo_cb) {
    uv__work_submit(loop,
                    &req->work_req,
                    UV__WORK_SLOW_IO,
                    uv__getnameinfo_work,
                    uv__getnameinfo_done);
    return 0;
  } else {
    uv__getnameinfo_work(&req->work_req);
    uv__getnameinfo_done(&req->work_req, 0);
    return req->retcode;
  }
}